

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int togglereadonlyall(int f,int n)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  buffer *pbVar3;
  bool bVar4;
  
  uVar1 = (uint)(allbro == 0);
  if (bheadp != (buffer *)0x0) {
    bVar4 = allbro == 0;
    pbVar3 = bheadp;
    allbro = (uint)(allbro == 0);
    do {
      __s = (pbVar3->b_list).l_name;
      if (*__s != '*') {
        sVar2 = strlen(__s);
        if (__s[(int)sVar2 + -1] != '*') {
          pbVar3->b_flag = pbVar3->b_flag & 0xefU | bVar4 << 4;
        }
      }
      pbVar3 = (pbVar3->b_list).l_p.x_bp;
      uVar1 = allbro;
    } while (pbVar3 != (buffer *)0x0);
  }
  allbro = uVar1;
  curwp->w_rflag = curwp->w_rflag | 0x10;
  return 1;
}

Assistant:

int
togglereadonlyall(int f, int n)
{
	struct buffer *bp = NULL;
	int len = 0;

	allbro = !allbro;
	for (bp = bheadp; bp != NULL; bp = bp->b_bufp) {
		len = strlen(bp->b_bname);
		if (bp->b_bname[0] != '*' && bp->b_bname[len - 1] != '*') {
			if (allbro)
				bp->b_flag |= BFREADONLY;
			else
				bp->b_flag &= ~BFREADONLY;
		}
	}
	curwp->w_rflag |= WFMODE;

	return (TRUE);
}